

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_TEXKILL(Context *ctx)

{
  RegisterType RVar1;
  char *pcVar2;
  
  if ((ctx->dest_arg).writemask == 0xf) {
    RVar1 = (ctx->dest_arg).regtype;
    if ((RVar1 == REG_TYPE_TEMP) || (RVar1 == REG_TYPE_ADDRESS)) {
      return;
    }
    pcVar2 = "TEXKILL must use a temp or texture register";
  }
  else {
    pcVar2 = "TEXKILL writemask must be .xyzw";
  }
  failf(ctx,"%s",pcVar2);
  return;
}

Assistant:

static void state_TEXKILL(Context *ctx)
{
    // The MSDN docs say this should be a source arg, but the driver docs
    //  say it's a dest arg. That's annoying.
    const DestArgInfo *info = &ctx->dest_arg;
    const RegisterType regtype = info->regtype;
    if (!writemask_xyzw(info->writemask))
        fail(ctx, "TEXKILL writemask must be .xyzw");
    else if ((regtype != REG_TYPE_TEMP) && (regtype != REG_TYPE_TEXTURE))
        fail(ctx, "TEXKILL must use a temp or texture register");

    // !!! FIXME: "If a temporary register is used, all components must have been previously written."
    // !!! FIXME: "If a texture register is used, all components that are read must have been declared."
    // !!! FIXME: there are further limitations in ps_1_3 and earlier.
}